

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O1

void quest_talk(monst *mtmp)

{
  byte *pbVar1;
  uchar uVar2;
  boolean bVar3;
  byte bVar4;
  uint uVar5;
  char *pcVar6;
  int msgnum;
  
  if (mtmp->m_id == quest_status.leader_m_id) {
    if ((mtmp->field_0x62 & 0x40) == 0) {
      if ((quest_status._0_4_ & 0x20) == 0) {
        qt_pager(0x12);
      }
      quest_status._0_4_ = quest_status._0_4_ | 0x20;
      pbVar1 = (byte *)((long)&mtmp->mstrategy + 3);
      *pbVar1 = *pbVar1 & 0xcf;
    }
    bVar3 = on_level(&u.uz,&dungeon_topology.d_qstart_level);
    if (bVar3 == '\0') {
      return;
    }
    if ((quest_status._0_4_ & 0x20) == 0) {
      chat_with_leader();
    }
    if ((quest_status._0_4_ & 0x20) == 0) {
      return;
    }
    pbVar1 = (byte *)((long)&mtmp->mstrategy + 3);
    *pbVar1 = *pbVar1 & 0xcf;
    mtmp->field_0x62 = mtmp->field_0x62 & 0xbf;
    return;
  }
  uVar2 = mtmp->data->msound;
  if (uVar2 != '\x18') {
    if (uVar2 != ' ') {
      return;
    }
    if (quest_status._0_2_ < 0) {
      uVar5 = mt_random();
      if (0x33333333 < uVar5 * -0x33333333) {
        return;
      }
      uVar5 = mt_random();
      qt_pager(uVar5 % 10 + 0x3c);
      return;
    }
    msgnum = 0x35;
    if ((u.uhave._0_1_ & 0x10) == 0) {
      uVar5 = (uint)quest_status._0_4_ >> 10 & 7;
      msgnum = 0x32;
      if (((((uint)quest_status._0_4_ >> 0xd & 1) != 0 && uVar5 != 1) && (msgnum = 0x33, 3 < uVar5))
         && (msgnum = 0x34, uVar5 == 7)) {
        uVar5 = mt_random();
        if (0x33333333 < uVar5 * -0x33333333) goto LAB_00229bb1;
        uVar5 = mt_random();
        msgnum = uVar5 % 10 + 0x3c;
      }
    }
    qt_pager(msgnum);
LAB_00229bb1:
    if ((~quest_status._0_4_ & 0x1c00) != 0) {
      quest_status._0_4_ = quest_status._0_4_ & 0xffffe3ff | quest_status._0_4_ + 0x400 & 0x1c00;
    }
    quest_status._0_4_ = quest_status._0_4_ | 0x2000;
    return;
  }
  if (mtmp->data != mons + 0x11d) {
    return;
  }
  if ((mtmp->mstrategy & 0x30000000) == 0) {
    return;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if (((((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))
            ) || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)))) goto LAB_00229d73;
      bVar4 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x00229cfc;
    }
  }
  else {
    bVar4 = worm_known(level,mtmp);
joined_r0x00229cfc:
    if (bVar4 == 0) goto LAB_00229d73;
  }
  uVar5 = *(uint *)&mtmp->field_0x60;
  if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar5 & 0x280) != 0) goto LAB_00229d73;
  }
  else if (((uVar5 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
  goto LAB_00229d73;
  if ((u._1052_1_ & 0x20) == 0) {
    pcVar6 = Monnam(mtmp);
    pline("%s speaks:",pcVar6);
  }
LAB_00229d73:
  verbalize("I\'m finally free!");
  pbVar1 = (byte *)((long)&mtmp->mstrategy + 3);
  *pbVar1 = *pbVar1 & 0xcf;
  mtmp->field_0x62 = mtmp->field_0x62 | 0x40;
  adjalign(3);
  angry_guards('\0');
  return;
}

Assistant:

void quest_talk(struct monst *mtmp)
{
    if (mtmp->m_id == Qstat(leader_m_id)) {
	leader_speaks(mtmp);
	return;
    }
    switch(mtmp->data->msound) {
	    case MS_NEMESIS:	nemesis_speaks(); break;
	    case MS_DJINNI:	prisoner_speaks(mtmp); break;
	    default:		break;
	}
}